

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int bb_serial_read(int pi,uint user_gpio,void *buf,size_t bufSize)

{
  int iVar1;
  undefined8 in_RCX;
  int in_EDX;
  int bytes;
  int in_stack_00000fe0;
  int in_stack_00000fe4;
  void *in_stack_00000fe8;
  int in_stack_00000ff4;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = pigpio_command(in_EDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_stack_ffffffffffffffe4,
                         in_stack_ffffffffffffffe0);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000ff4,in_stack_00000fe8,in_stack_00000fe4,in_stack_00000fe0);
  }
  _pmu(0);
  return iVar1;
}

Assistant:

int bb_serial_read(int pi, unsigned user_gpio, void *buf, size_t bufSize)
{
   int bytes;

   bytes = pigpio_command(pi, PI_CMD_SLR, user_gpio, bufSize, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, bufSize, bytes);
   }

   _pmu(pi);

   return bytes;
}